

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

void * __thiscall
google::protobuf::internal::SerialArena::AllocateAlignedFallback(SerialArena *this,size_t n)

{
  bool bVar1;
  void *ret;
  LogMessageFatal local_20 [16];
  
  AllocateNewBlock(this,n);
  ret = (void *)0x0;
  bVar1 = MaybeAllocateAligned(this,n,&ret);
  if (bVar1) {
    return ret;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/arena.cc"
             ,0x114,3,"res");
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_20);
}

Assistant:

PROTOBUF_NOINLINE
void* SerialArena::AllocateAlignedFallback(size_t n) {
  AllocateNewBlock(n);
  void* ret = nullptr;
  bool res = MaybeAllocateAligned(n, &ret);
  ABSL_DCHECK(res);
  return ret;
}